

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<char[5],int_const&,char_const(&)[7]>(char (*arg) [5],int *args,char (*args_1) [7])

{
  undefined8 in_RDI;
  string local_60 [8];
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_40 [16];
  char (*in_stack_ffffffffffffffd0) [7];
  int *in_stack_ffffffffffffffd8;
  
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffffa8);
  StringBuilder<int,char_const(&)[7]>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}